

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  SpectrumHandle SVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HomogeneousMedium *pHVar4;
  Float FVar5;
  Float FVar6;
  Float LeScale;
  Float sigScale;
  allocator<char> local_c1;
  string local_c0;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  Float g;
  SpectrumHandle Le;
  Allocator alloc_local;
  string preset;
  SpectrumHandle local_40;
  size_t local_38 [2];
  RGBColorSpace *local_28;
  
  sig_a.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  sig_s.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"preset",(allocator<char> *)&LeScale);
  std::__cxx11::string::string<std::allocator<char>>((string *)&Le,"",(allocator<char> *)&sigScale);
  ParameterDictionary::GetOneString(&preset,parameters,&local_c0,(string *)&Le);
  std::__cxx11::string::~string((string *)&Le);
  std::__cxx11::string::~string((string *)&local_c0);
  if (preset._M_string_length != 0) {
    bVar2 = GetMediumScatteringProperties(&preset,&sig_a,&sig_s,alloc);
    if (!bVar2) {
      Warning<std::__cxx11::string&>(loc,"Material preset \"%s\" not found.",&preset);
    }
  }
  if (sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"sigma_a",(allocator<char> *)&LeScale);
    local_28 = (RGBColorSpace *)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)&local_c0,
               (SpectrumType)&local_28,(Allocator)0x1);
    SVar1 = Le;
    sig_a = Le;
    std::__cxx11::string::~string((string *)&local_c0);
    if (SVar1.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
      *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0x3f800000;
      sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var,iVar3) | 0x1000000000000);
    }
  }
  if (sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"sigma_s",(allocator<char> *)&LeScale);
    local_38[1] = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)&local_c0,
               (SpectrumType)(local_38 + 1),(Allocator)0x1);
    SVar1 = Le;
    sig_s = Le;
    std::__cxx11::string::~string((string *)&local_c0);
    if (SVar1.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar3) = 0x3f800000;
      sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var_00,iVar3) | 0x1000000000000);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Le",(allocator<char> *)&LeScale);
  local_38[0] = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&Le,(string *)parameters,(SpectrumHandle *)&local_c0,
             (SpectrumType)local_38,(Allocator)0x2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Lescale",(allocator<char> *)&sigScale);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,&local_c0,1.0);
  std::__cxx11::string::~string((string *)&local_c0);
  LeScale = FVar5;
  if (Le.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits != 0) {
    FVar6 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
            ::Dispatch<pbrt::SpectrumHandle::MaxValue()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                        *)&Le);
    if ((FVar6 != 0.0) || (NAN(FVar6))) {
      local_40.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = Le.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              .bits;
      FVar6 = SpectrumToPhotometric(&local_40);
      LeScale = FVar5 / FVar6;
      goto LAB_003928be;
    }
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
  *(undefined4 *)CONCAT44(extraout_var_01,iVar3) = 0;
  Le.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(CONCAT44(extraout_var_01,iVar3) | 0x1000000000000);
LAB_003928be:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"scale",(allocator<char> *)&g);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,&local_c0,1.0);
  std::__cxx11::string::~string((string *)&local_c0);
  sigScale = FVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"g",&local_c1);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,&local_c0,0.0);
  std::__cxx11::string::~string((string *)&local_c0);
  g = FVar5;
  pHVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HomogeneousMedium,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,pbrt::SpectrumHandle&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&sig_a,&sig_s,&sigScale,&Le,&LeScale,(float *)&g,&alloc_local);
  std::__cxx11::string::~string((string *)&preset);
  return pHVar4;
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<ConstantSpectrum>(1.f);
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<ConstantSpectrum>(1.f);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeScale = parameters.GetOneFloat("Lescale", 1.f);
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeScale /= SpectrumToPhotometric(Le);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);
    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, LeScale, g,
                                               alloc);
}